

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcp_client.cpp
# Opt level: O2

bool tcp_send(char *command,uint8_t command_length)

{
  ulong __n;
  uint16_t uVar1;
  int iVar2;
  uint8_t *data;
  ulong uVar3;
  ssize_t sVar4;
  undefined7 in_register_00000031;
  bool bVar5;
  uint8_t response [5];
  
  uVar3 = CONCAT71(in_register_00000031,command_length) & 0xffffffff;
  __n = uVar3 + 2;
  data = (uint8_t *)operator_new__(__n);
  strncpy((char *)data,command,uVar3);
  uVar1 = crc16(data,command_length);
  *(uint16_t *)(data + uVar3) = uVar1;
  bVar5 = false;
  uVar3 = send(tcp_socket,data,__n,0);
  operator_delete(data);
  if (uVar3 == __n) {
    bVar5 = false;
    sVar4 = recv(tcp_socket,response,5,0);
    if (sVar4 == 5) {
      uVar1 = crc16(response,'\x03');
      if (response._3_2_ == uVar1) {
        iVar2 = bcmp("yup",response,3);
        bVar5 = iVar2 == 0;
      }
      else {
        bVar5 = false;
      }
    }
  }
  return bVar5;
}

Assistant:

bool tcp_send(const char *command, uint8_t command_length)
{
    uint8_t *data = new uint8_t[command_length + 2];
    strncpy((char*)data, command, command_length);

    uint16_t crc = crc16(data, command_length);

    data[command_length] = crc & 0xFF;
    data[command_length + 1] = crc >> 8;

    if (send(tcp_socket, data, command_length + 2, 0) != command_length + 2)
    {
        delete data;
        return false;
    }

    delete data;

    uint8_t response[5];

    if (recv(tcp_socket, response, 5, 0) != 5)
        return false;

    crc = response[4] << 8;
    crc |= response[3];

    if (crc != crc16(response, 3))
        return false;

    if (strncmp("yup", (char*)response, 3) != 0)
        return false;

    return true;
}